

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O0

int AR30ToABGR(uint8_t *src_ar30,int src_stride_ar30,uint8_t *dst_abgr,int dst_stride_abgr,int width
              ,int height)

{
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int y;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  uint8_t *local_20;
  int local_14;
  uint8_t *local_10;
  int local_4;
  
  if ((((in_RDI == (uint8_t *)0x0) || (in_RDX == (uint8_t *)0x0)) || (in_R8D < 1)) || (in_R9D == 0))
  {
    local_4 = -1;
  }
  else {
    local_2c = in_R9D;
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_R9D < 0) {
      local_2c = -in_R9D;
      local_10 = in_RDI + (local_2c + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    local_28 = in_R8D;
    local_24 = in_ECX;
    if ((local_14 == in_R8D << 2) && (in_ECX == in_R8D << 2)) {
      local_28 = local_2c * in_R8D;
      local_2c = 1;
      local_24 = 0;
      local_14 = 0;
    }
    local_20 = in_RDX;
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      AR30ToABGRRow_C(local_10,local_20,local_28);
      local_10 = local_10 + local_14;
      local_20 = local_20 + local_24;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int AR30ToABGR(const uint8_t* src_ar30,
               int src_stride_ar30,
               uint8_t* dst_abgr,
               int dst_stride_abgr,
               int width,
               int height) {
  int y;
  if (!src_ar30 || !dst_abgr || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_ar30 = src_ar30 + (height - 1) * src_stride_ar30;
    src_stride_ar30 = -src_stride_ar30;
  }
  // Coalesce rows.
  if (src_stride_ar30 == width * 4 && dst_stride_abgr == width * 4) {
    width *= height;
    height = 1;
    src_stride_ar30 = dst_stride_abgr = 0;
  }
  for (y = 0; y < height; ++y) {
    AR30ToABGRRow_C(src_ar30, dst_abgr, width);
    src_ar30 += src_stride_ar30;
    dst_abgr += dst_stride_abgr;
  }
  return 0;
}